

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fVertexAttributeBindingStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_1::VertexBindingBufferCase::test
          (VertexBindingBufferCase *this,ResultCollector *result)

{
  TestLog *pTVar1;
  int iVar2;
  GLenum GVar3;
  undefined4 extraout_var;
  int binding;
  int index;
  allocator<char> local_161;
  GLuint otherBuffer_1;
  VertexArray otherVao_1;
  CallLogWrapper gl;
  ScopedLogSection section;
  GLint reportedMaxBindings;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string local_c0;
  ScopedLogSection section_1;
  code *local_98;
  GLenum local_90;
  VertexArray vao;
  Buffer otherBuffer;
  VertexArray otherVao;
  Buffer buffer;
  
  iVar2 = (*((this->super_IndexedCase).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext
            [3])();
  glu::CallLogWrapper::CallLogWrapper
            (&gl,(Functions *)CONCAT44(extraout_var,iVar2),
             ((this->super_IndexedCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
             m_log);
  glu::TypedObjectWrapper<(glu::ObjectType)5>::TypedObjectWrapper
            (&vao,((this->super_IndexedCase).super_TestCase.m_context)->m_renderCtx);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            (&buffer,((this->super_IndexedCase).super_TestCase.m_context)->m_renderCtx);
  reportedMaxBindings = -1;
  gl.m_enableLog = true;
  glu::CallLogWrapper::glBindVertexArray(&gl,vao.super_ObjectWrapper.m_object);
  glu::CallLogWrapper::glGetIntegerv(&gl,0x82da,&reportedMaxBindings);
  GVar3 = glu::CallLogWrapper::glGetError(&gl);
  if (GVar3 != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e0,"Got Error ",(allocator<char> *)&otherBuffer);
    otherVao.super_ObjectWrapper.m_gl = (Functions *)glu::getErrorName;
    otherVao.super_ObjectWrapper.m_traits._0_4_ = GVar3;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_c0,&otherVao);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   &local_e0,&local_c0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &otherBuffer_1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   ": ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&otherVao_1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &otherBuffer_1,"glGetIntegerv");
    tcu::ResultCollector::fail(result,(string *)&otherVao_1);
    std::__cxx11::string::~string((string *)&otherVao_1);
    std::__cxx11::string::~string((string *)&otherBuffer_1);
    std::__cxx11::string::~string((string *)&section);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
  }
  iVar2 = 0x10;
  if (0x10 < reportedMaxBindings) {
    iVar2 = reportedMaxBindings;
  }
  pTVar1 = ((this->super_IndexedCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&otherVao_1,"initial",(allocator<char> *)&local_e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&otherBuffer_1,"Initial values",(allocator<char> *)&local_c0);
  tcu::ScopedLogSection::ScopedLogSection
            (&section,pTVar1,(string *)&otherVao_1,(string *)&otherBuffer_1);
  std::__cxx11::string::~string((string *)&otherBuffer_1);
  std::__cxx11::string::~string((string *)&otherVao_1);
  for (index = 0; iVar2 != index; index = index + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              (result,&gl,0x8f4f,index,0,(this->super_IndexedCase).m_verifier);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  pTVar1 = ((this->super_IndexedCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&otherVao_1,"vao",(allocator<char> *)&section);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&otherBuffer_1,"VAO state",(allocator<char> *)&local_e0);
  tcu::ScopedLogSection::ScopedLogSection
            (&section_1,pTVar1,(string *)&otherVao_1,(string *)&otherBuffer_1);
  std::__cxx11::string::~string((string *)&otherBuffer_1);
  std::__cxx11::string::~string((string *)&otherVao_1);
  glu::TypedObjectWrapper<(glu::ObjectType)5>::TypedObjectWrapper
            (&otherVao,((this->super_IndexedCase).super_TestCase.m_context)->m_renderCtx);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            (&otherBuffer,((this->super_IndexedCase).super_TestCase.m_context)->m_renderCtx);
  glu::CallLogWrapper::glBindVertexBuffer(&gl,1,buffer.super_ObjectWrapper.m_object,0,0x20);
  GVar3 = glu::CallLogWrapper::glGetError(&gl);
  if (GVar3 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"Got Error ",&local_161);
    local_98 = glu::getErrorName;
    local_90 = GVar3;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_c0,&local_98);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   &local_e0,&local_c0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &otherBuffer_1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   ": ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&otherVao_1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &otherBuffer_1,"glBindVertexBuffer");
    tcu::ResultCollector::fail(result,(string *)&otherVao_1);
    std::__cxx11::string::~string((string *)&otherVao_1);
    std::__cxx11::string::~string((string *)&otherBuffer_1);
    std::__cxx11::string::~string((string *)&section);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
  }
  glu::CallLogWrapper::glBindVertexArray(&gl,otherVao.super_ObjectWrapper.m_object);
  GVar3 = glu::CallLogWrapper::glGetError(&gl);
  if (GVar3 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"Got Error ",&local_161);
    local_98 = glu::getErrorName;
    local_90 = GVar3;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_c0,&local_98);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   &local_e0,&local_c0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &otherBuffer_1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   ": ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&otherVao_1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &otherBuffer_1,"glBindVertexArray");
    tcu::ResultCollector::fail(result,(string *)&otherVao_1);
    std::__cxx11::string::~string((string *)&otherVao_1);
    std::__cxx11::string::~string((string *)&otherBuffer_1);
    std::__cxx11::string::~string((string *)&section);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
  }
  glu::CallLogWrapper::glBindVertexBuffer(&gl,1,otherBuffer.super_ObjectWrapper.m_object,0,0x20);
  GVar3 = glu::CallLogWrapper::glGetError(&gl);
  if (GVar3 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"Got Error ",&local_161);
    local_98 = glu::getErrorName;
    local_90 = GVar3;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_c0,&local_98);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   &local_e0,&local_c0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &otherBuffer_1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   ": ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&otherVao_1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &otherBuffer_1,"glBindVertexBuffer");
    tcu::ResultCollector::fail(result,(string *)&otherVao_1);
    std::__cxx11::string::~string((string *)&otherVao_1);
    std::__cxx11::string::~string((string *)&otherBuffer_1);
    std::__cxx11::string::~string((string *)&section);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
  }
  glu::CallLogWrapper::glBindVertexArray(&gl,vao.super_ObjectWrapper.m_object);
  GVar3 = glu::CallLogWrapper::glGetError(&gl);
  if (GVar3 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"Got Error ",&local_161);
    local_98 = glu::getErrorName;
    local_90 = GVar3;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_c0,&local_98);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   &local_e0,&local_c0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &otherBuffer_1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   ": ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&otherVao_1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &otherBuffer_1,"glBindVertexArray");
    tcu::ResultCollector::fail(result,(string *)&otherVao_1);
    std::__cxx11::string::~string((string *)&otherVao_1);
    std::__cxx11::string::~string((string *)&otherBuffer_1);
    std::__cxx11::string::~string((string *)&section);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
  }
  deqp::gls::StateQueryUtil::verifyStateIndexedInteger
            (result,&gl,0x8f4f,1,buffer.super_ObjectWrapper.m_object,
             (this->super_IndexedCase).m_verifier);
  glu::ObjectWrapper::~ObjectWrapper(&otherBuffer.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&otherVao.super_ObjectWrapper);
  tcu::ScopedLogSection::~ScopedLogSection(&section_1);
  pTVar1 = ((this->super_IndexedCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&otherVao_1,"autoUnbind",(allocator<char> *)&local_e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&otherBuffer_1,"Unbind on delete",(allocator<char> *)&local_c0);
  tcu::ScopedLogSection::ScopedLogSection
            (&section,pTVar1,(string *)&otherVao_1,(string *)&otherBuffer_1);
  std::__cxx11::string::~string((string *)&otherBuffer_1);
  std::__cxx11::string::~string((string *)&otherVao_1);
  glu::TypedObjectWrapper<(glu::ObjectType)5>::TypedObjectWrapper
            (&otherVao_1,((this->super_IndexedCase).super_TestCase.m_context)->m_renderCtx);
  otherBuffer_1 = 0xffffffff;
  glu::CallLogWrapper::glGenBuffers(&gl,1,&otherBuffer_1);
  glu::CallLogWrapper::glBindVertexBuffer(&gl,1,otherBuffer_1,0,0x20);
  glu::CallLogWrapper::glBindVertexArray(&gl,otherVao_1.super_ObjectWrapper.m_object);
  glu::CallLogWrapper::glBindVertexBuffer(&gl,1,otherBuffer_1,0,0x20);
  glu::CallLogWrapper::glDeleteBuffers(&gl,1,&otherBuffer_1);
  deqp::gls::StateQueryUtil::verifyStateIndexedInteger
            (result,&gl,0x8f4f,1,0,(this->super_IndexedCase).m_verifier);
  glu::CallLogWrapper::glBindVertexArray(&gl,vao.super_ObjectWrapper.m_object);
  deqp::gls::StateQueryUtil::verifyStateIndexedInteger
            (result,&gl,0x8f4f,1,otherBuffer_1,(this->super_IndexedCase).m_verifier);
  glu::ObjectWrapper::~ObjectWrapper(&otherVao_1.super_ObjectWrapper);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  glu::ObjectWrapper::~ObjectWrapper(&buffer.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&vao.super_ObjectWrapper);
  glu::CallLogWrapper::~CallLogWrapper(&gl);
  return;
}

Assistant:

void VertexBindingBufferCase::test (tcu::ResultCollector& result)
{
	glu::CallLogWrapper gl					(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	glu::VertexArray	vao					(m_context.getRenderContext());
	glu::Buffer			buffer				(m_context.getRenderContext());
	glw::GLint			reportedMaxBindings	= -1;
	glw::GLint			maxBindings;

	gl.enableLogging(true);

	gl.glBindVertexArray(*vao);
	gl.glGetIntegerv(GL_MAX_VERTEX_ATTRIB_BINDINGS, &reportedMaxBindings);
	GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glGetIntegerv");

	maxBindings = de::max(16, reportedMaxBindings);

	// initial
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "initial", "Initial values");

		for (int binding = 0; binding < maxBindings; ++binding)
			verifyStateIndexedInteger(result, gl, GL_VERTEX_BINDING_BUFFER, binding, 0, m_verifier);
	}

	// is part of vao
	{
		const tcu::ScopedLogSection section			(m_testCtx.getLog(), "vao", "VAO state");
		glu::VertexArray			otherVao		(m_context.getRenderContext());
		glu::Buffer					otherBuffer		(m_context.getRenderContext());

		// set to value A in vao1
		gl.glBindVertexBuffer(1, *buffer, 0, 32);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glBindVertexBuffer");

		// set to value B in vao2
		gl.glBindVertexArray(*otherVao);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glBindVertexArray");
		gl.glBindVertexBuffer(1, *otherBuffer, 0, 32);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glBindVertexBuffer");

		// check value is still ok in original vao
		gl.glBindVertexArray(*vao);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glBindVertexArray");

		verifyStateIndexedInteger(result, gl, GL_VERTEX_BINDING_BUFFER, 1, *buffer, m_verifier);
	}

	// Is detached in delete from active vao and not from deactive
	{
		const tcu::ScopedLogSection section			(m_testCtx.getLog(), "autoUnbind", "Unbind on delete");
		glu::VertexArray			otherVao		(m_context.getRenderContext());
		glw::GLuint					otherBuffer		= -1;

		gl.glGenBuffers(1, &otherBuffer);

		// set in vao1 and vao2
		gl.glBindVertexBuffer(1, otherBuffer, 0, 32);
		gl.glBindVertexArray(*otherVao);
		gl.glBindVertexBuffer(1, otherBuffer, 0, 32);

		// delete buffer. This unbinds it from active (vao2) but not from unactive
		gl.glDeleteBuffers(1, &otherBuffer);
		verifyStateIndexedInteger(result, gl, GL_VERTEX_BINDING_BUFFER, 1, 0, m_verifier);

		gl.glBindVertexArray(*vao);
		verifyStateIndexedInteger(result, gl, GL_VERTEX_BINDING_BUFFER, 1, otherBuffer, m_verifier);
	}
}